

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task28.cpp
# Opt level: O3

bool is_sort(vector<int,_std::allocator<int>_> *arr,int len,Order type)

{
  pointer piVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  
  if (type == DESC) {
    if (len < 2) {
      return true;
    }
    piVar1 = (arr->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    uVar2 = 1;
    do {
      if (piVar1[uVar2 - 1] < piVar1[uVar2]) {
        return false;
      }
      uVar2 = uVar2 + 1;
      bVar3 = (uint)len < uVar2;
      bVar4 = (uint)len == uVar2;
    } while (!bVar4);
  }
  else {
    if (len < 2) {
      return true;
    }
    piVar1 = (arr->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    uVar2 = 1;
    do {
      if (piVar1[uVar2] < piVar1[uVar2 - 1]) {
        return false;
      }
      uVar2 = uVar2 + 1;
      bVar3 = (uint)len < uVar2;
      bVar4 = (uint)len == uVar2;
    } while (!bVar4);
  }
  return bVar3 || bVar4;
}

Assistant:

bool is_sort(vector<int> arr, int len, Order type){
    switch (type) {
        case DESC:
            for (int i = 1; i < len; i++) {
                if (arr[i - 1] < arr[i]) {
                    return false;
                }
            }
            return true;
        case ABC:
            for (int i = 1; i < len; i++) {
                if (arr[i - 1] > arr[i]) {
                    return false;
                }
            }
            return true;
    }
}